

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalized_cepstrum_inverse_gain_normalization.cc
# Opt level: O0

bool __thiscall
sptk::GeneralizedCepstrumInverseGainNormalization::Run
          (GeneralizedCepstrumInverseGainNormalization *this,
          vector<double,_std::allocator<double>_> *normalized_generalized_cepstrum,
          vector<double,_std::allocator<double>_> *generalized_cepstrum)

{
  size_type sVar1;
  const_reference pvVar2;
  reference pvVar3;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> in_RDI;
  double __n;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  vector<double,_std::allocator<double>_> *this_00;
  double z;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff58;
  anon_class_8_1_54a3981a in_stack_ffffffffffffff60;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff70;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff78;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff80;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff88;
  
  if (((((ulong)((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *
                 )in_RDI._M_current)[3]._M_current & 1) != 0) &&
      (sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RSI),
      sVar1 == (long)(*(int *)&((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                                 *)in_RDI._M_current)[1]._M_current + 1))) &&
     (in_RDX != (vector<double,_std::allocator<double>_> *)0x0)) {
    sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
    if (sVar1 != (long)(*(int *)&((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                                   *)in_RDI._M_current)[1]._M_current + 1)) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff80._M_current,
                 (size_type)in_stack_ffffffffffffff78._M_current);
    }
    if (((double)((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                   *)in_RDI._M_current)[2]._M_current != 0.0) ||
       (NAN((double)((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                      *)in_RDI._M_current)[2]._M_current))) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
      __first._M_current =
           (double *)
           pow(*pvVar2,((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                         *)in_RDI._M_current)[2]._M_current);
      this_00 = (vector<double,_std::allocator<double>_> *)
                (((double)__first._M_current - 1.0) /
                (double)((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                          *)in_RDI._M_current)[2]._M_current);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,0);
      *pvVar3 = (value_type)this_00;
      std::vector<double,_std::allocator<double>_>::begin(this_00);
      __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator+((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *)
                in_RDI._M_current,(difference_type)in_stack_ffffffffffffff60.z);
      std::vector<double,_std::allocator<double>_>::end(this_00);
      std::vector<double,_std::allocator<double>_>::begin(this_00);
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                in_RDI._M_current,(difference_type)in_stack_ffffffffffffff60.z);
      std::
      transform<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,sptk::GeneralizedCepstrumInverseGainNormalization::Run(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>*)const::__0>
                (__first,in_stack_ffffffffffffff70,in_RDI,in_stack_ffffffffffffff60);
    }
    else {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
      __n = log(*pvVar2);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,0);
      *pvVar3 = __n;
      std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff58);
      __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator+((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *)
                in_RDI._M_current,(difference_type)__n);
      std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff58);
      std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff58);
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                in_RDI._M_current,(difference_type)__n);
      std::
      copy<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    return true;
  }
  return false;
}

Assistant:

bool GeneralizedCepstrumInverseGainNormalization::Run(
    const std::vector<double>& normalized_generalized_cepstrum,
    std::vector<double>* generalized_cepstrum) const {
  // Check inputs.
  if (!is_valid_ ||
      normalized_generalized_cepstrum.size() !=
          static_cast<std::size_t>(num_order_ + 1) ||
      NULL == generalized_cepstrum) {
    return false;
  }

  // Prepare memories.
  if (generalized_cepstrum->size() !=
      static_cast<std::size_t>(num_order_ + 1)) {
    generalized_cepstrum->resize(num_order_ + 1);
  }

  if (0.0 == gamma_) {
    (*generalized_cepstrum)[0] = std::log(normalized_generalized_cepstrum[0]);
    std::copy(normalized_generalized_cepstrum.begin() + 1,
              normalized_generalized_cepstrum.end(),
              generalized_cepstrum->begin() + 1);
  } else {
    const double z(std::pow(normalized_generalized_cepstrum[0], gamma_));
    (*generalized_cepstrum)[0] = (z - 1.0) / gamma_;
    std::transform(normalized_generalized_cepstrum.begin() + 1,
                   normalized_generalized_cepstrum.end(),
                   generalized_cepstrum->begin() + 1,
                   [z](double c) { return c * z; });
  }

  return true;
}